

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O0

void __thiscall Manifold_MirrorUnion2_Test::TestBody(Manifold_MirrorUnion2_Test *this)

{
  allocator<manifold::Manifold> *this_00;
  initializer_list<manifold::Manifold> __l;
  byte bVar1;
  bool bVar2;
  char *message;
  char *in_R9;
  Manifold *local_130;
  string local_118;
  AssertHelper local_f8;
  Message local_f0;
  bool local_e1;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_;
  double local_c0;
  double local_b8;
  double local_b0;
  vec<double,_3> local_a8;
  Manifold *local_90;
  Manifold local_88 [16];
  iterator local_78;
  size_type local_70;
  vector<manifold::Manifold,_std::allocator<manifold::Manifold>_> local_68;
  vector local_50 [8];
  Manifold result;
  double local_40;
  vec<double,_3> local_38;
  Manifold local_20 [8];
  Manifold a;
  Manifold_MirrorUnion2_Test *this_local;
  
  local_40 = 1.0;
  linalg::vec<double,_3>::vec(&local_38,&local_40);
  manifold::Manifold::Cube(local_20,0);
  local_90 = local_88;
  local_b0 = 1.0;
  local_b8 = 0.0;
  local_c0 = 0.0;
  linalg::vec<double,_3>::vec(&local_a8,&local_b0,&local_b8,&local_c0);
  manifold::Manifold::Mirror(local_88,local_20);
  local_78 = local_88;
  local_70 = 1;
  this_00 = (allocator<manifold::Manifold> *)
            ((long)&gtest_ar_.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 3);
  std::allocator<manifold::Manifold>::allocator(this_00);
  __l._M_len = local_70;
  __l._M_array = local_78;
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::vector
            (&local_68,__l,this_00);
  manifold::Manifold::Compose(local_50);
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::~vector(&local_68);
  std::allocator<manifold::Manifold>::~allocator
            ((allocator<manifold::Manifold> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 3));
  local_130 = (Manifold *)&local_78;
  do {
    local_130 = local_130 + -0x10;
    manifold::Manifold::~Manifold(local_130);
  } while (local_130 != local_88);
  bVar1 = manifold::Manifold::MatchesTriNormals();
  local_e1 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e0,&local_e1,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar2) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_118,(internal *)local_e0,(AssertionResult *)"result.MatchesTriNormals()",
               "false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x303,message);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  manifold::Manifold::~Manifold((Manifold *)local_50);
  manifold::Manifold::~Manifold(local_20);
  return;
}

Assistant:

TEST(Manifold, MirrorUnion2) {
  auto a = Manifold::Cube();
  auto result = Manifold::Compose({a.Mirror({1, 0, 0})});
  EXPECT_TRUE(result.MatchesTriNormals());
}